

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gecko.cpp
# Opt level: O0

ssize_t __thiscall ChacoGraph::read(ChacoGraph *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  string *psVar4;
  undefined8 uVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 in_register_00000034;
  string message;
  ostringstream ss_3;
  Index j_1;
  Index i_1;
  Index a;
  ostringstream ss_2;
  double w;
  uint j;
  uint k;
  int n;
  ostringstream ss_1;
  ostringstream ss;
  Index i;
  bool weighted;
  uint fmt;
  uint ne;
  uint nv;
  char line [65536];
  Index in_stack_fffffffffffef79c;
  Graph *in_stack_fffffffffffef7a0;
  allocator *__lhs;
  undefined4 in_stack_fffffffffffef7e0;
  undefined4 in_stack_fffffffffffef7e4;
  undefined4 in_stack_fffffffffffef7e8;
  undefined4 in_stack_fffffffffffef7ec;
  bool bStack_107e1;
  allocator aStack_10739;
  string asStack_10738 [71];
  allocator aStack_106f1;
  string asStack_106f0 [64];
  ostringstream aoStack_106b0 [376];
  Index IStack_10538;
  uint uStack_10534;
  int iStack_10530;
  undefined1 uStack_1052b;
  allocator aStack_1052a;
  undefined1 uStack_10529;
  ostringstream aoStack_10508 [376];
  double dStack_10390;
  undefined1 auStack_10388 [4];
  uint uStack_10384;
  int iStack_10380;
  undefined1 uStack_10379;
  ostringstream aoStack_10358 [383];
  undefined1 uStack_101d9;
  ostringstream aoStack_101b8 [376];
  uint uStack_10040;
  undefined1 uStack_10039;
  allocator aStack_10038;
  undefined1 uStack_10037;
  allocator aStack_10036;
  byte bStack_10035;
  int iStack_10034;
  undefined1 auStack_10030 [4];
  uint uStack_1002c;
  undefined1 uStack_10026;
  allocator aaStack_10025 [13];
  char acStack_10018 [65560];
  
  pcVar3 = fgets(acStack_10018,0x10000,(FILE *)CONCAT44(in_register_00000034,__fd));
  if (pcVar3 == (char *)0x0) {
    uStack_10026 = 1;
    psVar4 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(psVar4,"file is empty",aaStack_10025);
    uStack_10026 = 0;
    __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  bStack_10035 = 0;
  iVar1 = sscanf(acStack_10018,"%u%u%u",&uStack_1002c,auStack_10030,&iStack_10034);
  if (iVar1 != 2) {
    if (iVar1 != 3) {
      uStack_10039 = 1;
      psVar4 = (string *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(psVar4,"invalid first line in graph file",&aStack_10038);
      uStack_10039 = 0;
      __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    if (iStack_10034 != 0) {
      if (iStack_10034 != 1) {
        uStack_10037 = 1;
        psVar4 = (string *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(psVar4,"invalid graph format specifier",&aStack_10036);
        uStack_10037 = 0;
        __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      bStack_10035 = 1;
    }
  }
  uStack_10040 = 1;
  do {
    if (uStack_1002c < uStack_10040) {
      iStack_10530 = Gecko::Graph::directed();
      if (iStack_10530 != 0) {
        uStack_10534 = Gecko::Graph::arc_source((uint)this);
        IStack_10538 = Gecko::Graph::arc_target(in_stack_fffffffffffef7a0,in_stack_fffffffffffef79c)
        ;
        std::__cxx11::ostringstream::ostringstream(aoStack_106b0);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)aoStack_106b0,uStack_10534);
        poVar6 = std::operator<<(poVar6,", ");
        std::ostream::operator<<(poVar6,IStack_10538);
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0x20);
        __lhs = &aStack_106f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(asStack_106f0,"no arc (",__lhs);
        std::__cxx11::ostringstream::str();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       __rhs);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(asStack_10738,"): graph is directed",&aStack_10739);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       __rhs);
        __cxa_throw(__rhs,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      return 1;
    }
    uVar2 = Gecko::Graph::insert_node(1.0);
    if (uVar2 != uStack_10040) {
      std::__cxx11::ostringstream::ostringstream(aoStack_101b8);
      std::ostream::operator<<((ostream *)aoStack_101b8,uStack_10040);
      uStack_101d9 = 1;
      uVar5 = __cxa_allocate_exception(0x20);
      std::__cxx11::ostringstream::str();
      std::operator+((char *)CONCAT44(in_stack_fffffffffffef7ec,in_stack_fffffffffffef7e8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffef7e4,in_stack_fffffffffffef7e0));
      uStack_101d9 = 0;
      __cxa_throw(uVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    do {
      pcVar3 = fgets(acStack_10018,0x10000,(FILE *)CONCAT44(in_register_00000034,__fd));
      if (pcVar3 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream(aoStack_10358);
        std::ostream::operator<<((ostream *)aoStack_10358,uStack_10040);
        uStack_10379 = 1;
        uVar5 = __cxa_allocate_exception(0x20);
        std::__cxx11::ostringstream::str();
        std::operator+((char *)CONCAT44(in_stack_fffffffffffef7ec,in_stack_fffffffffffef7e8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffef7e4,in_stack_fffffffffffef7e0));
        uStack_10379 = 0;
        __cxa_throw(uVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      bStack_107e1 = acStack_10018[0] == '%' || acStack_10018[0] == '#';
    } while (bStack_107e1);
    uStack_10384 = 0;
    while (iVar1 = sscanf(acStack_10018 + uStack_10384,"%u%n",auStack_10388,&iStack_10380),
          iVar1 == 1) {
      dStack_10390 = 1.0;
      if ((bStack_10035 & 1) != 0) {
        uStack_10384 = iStack_10380 + uStack_10384;
        iVar1 = sscanf(acStack_10018 + uStack_10384,"%lf%n",&dStack_10390,&iStack_10380);
        if (iVar1 != 1) {
          std::__cxx11::ostringstream::ostringstream(aoStack_10508);
          std::ostream::operator<<((ostream *)aoStack_10508,uStack_10040);
          uStack_10529 = 1;
          uVar5 = __cxa_allocate_exception(0x20);
          std::__cxx11::ostringstream::str();
          std::operator+((char *)CONCAT44(in_stack_fffffffffffef7ec,in_stack_fffffffffffef7e8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffef7e4,in_stack_fffffffffffef7e0));
          uStack_10529 = 0;
          __cxa_throw(uVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
      }
      iVar1 = Gecko::Graph::insert_arc
                        ((uint)this,uStack_10040,(float)dStack_10390,(float)dStack_10390);
      if (iVar1 == 0) {
        uStack_1052b = 1;
        psVar4 = (string *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(psVar4,"arc insertion failed",&aStack_1052a);
        uStack_1052b = 0;
        __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      uStack_10384 = iStack_10380 + uStack_10384;
    }
    uStack_10040 = uStack_10040 + 1;
  } while( true );
}

Assistant:

bool
ChacoGraph::read(FILE* file)
{
  try {
    char line[0x10000];
    if (!fgets(line, sizeof(line), file))
      throw std::string("file is empty");

    // determine number of nodes, edges, and type of graph
    unsigned int nv, ne, fmt;
    bool weighted = false;
    switch (sscanf(line, "%u%u%u", &nv, &ne, &fmt)) {
      case 2:
        break;
      case 3:
        switch (fmt) {
          case 0:
            break;
          case 1:
            weighted = true;
            break;
          default:
            throw std::string("invalid graph format specifier");
        }
        break;
      default:
        throw std::string("invalid first line in graph file");
    }

    // read nodes and their neighbors
    for (Node::Index i = 1; i <= nv; i++) {
      if (insert_node() != i) {
        std::ostringstream ss;
        ss << i;
        throw std::string("cannot insert node" + ss.str());
      }
      do {
        if (!fgets(line, sizeof(line), file)) {
          std::ostringstream ss;
          ss << i;
          throw std::string("no data for node" + ss.str());
        }
      } while (line[0] == '%' || line[0] == '#');
      int n;
      for (unsigned int k = 0, j; sscanf(line + k, "%u%n", &j, &n) == 1; k += n) {
        double w = 1;
        if (weighted) {
          k += n;
          if (sscanf(line + k, "%lf%n", &w, &n) != 1) {
            std::ostringstream ss;
            ss << i;
            throw std::string("cannot read weight for node" + ss.str());
          }
        }
        if (!insert_arc(i, j, Float(w), Float(w)))
          throw std::string("arc insertion failed");
      }
    }

    // make sure graph is undirected
    Arc::Index a = directed();
    if (a) {
      Node::Index i = arc_source(a);
      Node::Index j = arc_target(a);
      std::ostringstream ss;
      ss << i << ", " << j;
      throw std::string("no arc (") + ss.str() + std::string("): graph is directed");
    }
  }
  catch (std::string message) {
    std::cerr << "ERROR: " << message << std::endl;
    return false;
  }

  return true;
}